

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O0

int coda_pcre2_substring_copy_bynumber_8
              (pcre2_match_data_8 *match_data,uint32_t stringnumber,PCRE2_UCHAR8 *buffer,
              size_t *sizeptr)

{
  size_t local_40;
  size_t size;
  size_t *psStack_30;
  int rc;
  size_t *sizeptr_local;
  PCRE2_UCHAR8 *buffer_local;
  pcre2_match_data_8 *ppStack_18;
  uint32_t stringnumber_local;
  pcre2_match_data_8 *match_data_local;
  
  psStack_30 = sizeptr;
  sizeptr_local = (size_t *)buffer;
  buffer_local._4_4_ = stringnumber;
  ppStack_18 = match_data;
  size._4_4_ = coda_pcre2_substring_length_bynumber_8(match_data,stringnumber,&local_40);
  match_data_local._4_4_ = size._4_4_;
  if (-1 < size._4_4_) {
    if (*psStack_30 < local_40 + 1) {
      match_data_local._4_4_ = -0x30;
    }
    else {
      memcpy(sizeptr_local,ppStack_18->subject + ppStack_18->ovector[buffer_local._4_4_ << 1],
             local_40);
      *(undefined1 *)((long)sizeptr_local + local_40) = 0;
      *psStack_30 = local_40;
      match_data_local._4_4_ = 0;
    }
  }
  return match_data_local._4_4_;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_copy_bynumber(pcre2_match_data *match_data,
  uint32_t stringnumber, PCRE2_UCHAR *buffer, PCRE2_SIZE *sizeptr)
{
int rc;
PCRE2_SIZE size;
rc = pcre2_substring_length_bynumber(match_data, stringnumber, &size);
if (rc < 0) return rc;
if (size + 1 > *sizeptr) return PCRE2_ERROR_NOMEMORY;
memcpy(buffer, match_data->subject + match_data->ovector[stringnumber*2],
  CU2BYTES(size));
buffer[size] = 0;
*sizeptr = size;
return 0;
}